

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int nn_pipe_send(nn_pipe *self,nn_msg *msg)

{
  FILE *__stream;
  uint uVar1;
  char *pcVar2;
  undefined8 uVar3;
  
  if (self[0x62] == (nn_pipe)0x1) {
    self[0x62] = (nn_pipe)0x2;
    uVar1 = (*(code *)**(undefined8 **)(self + 0x58))();
    if ((int)uVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(-uVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-uVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/pipe.c"
              ,0xba);
      goto LAB_0011ee56;
    }
    if (self[0x62] == (nn_pipe)0x3) {
      self[0x62] = (nn_pipe)0x1;
      return uVar1;
    }
    if (self[0x62] == (nn_pipe)0x2) {
      self[0x62] = (nn_pipe)0x4;
      return uVar1 | 1;
    }
    nn_backtrace_print();
    pcVar2 = "pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENDING";
    uVar3 = 0xbf;
  }
  else {
    nn_backtrace_print();
    pcVar2 = "pipebase->outstate == NN_PIPEBASE_OUTSTATE_IDLE";
    uVar3 = 0xb7;
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/pipe.c"
          ,uVar3);
LAB_0011ee56:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_pipe_send (struct nn_pipe *self, struct nn_msg *msg)
{
    int rc;
    struct nn_pipebase *pipebase;

    pipebase = (struct nn_pipebase*) self;
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_IDLE);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_SENDING;
    rc = pipebase->vfptr->send (pipebase, msg);
    errnum_assert (rc >= 0, -rc);
    if (nn_fast (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENT)) {
        pipebase->outstate = NN_PIPEBASE_OUTSTATE_IDLE;
        return rc;
    }
    nn_assert (pipebase->outstate == NN_PIPEBASE_OUTSTATE_SENDING);
    pipebase->outstate = NN_PIPEBASE_OUTSTATE_ASYNC;
    return rc | NN_PIPEBASE_RELEASE;
}